

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00352df0 == '\x01') {
    DAT_00352df0 = '\0';
    (*(code *)*_ItemSimilarityRecommender_ConnectedItem_default_instance_)();
  }
  if (DAT_00352e38 == '\x01') {
    DAT_00352e38 = '\0';
    (*(code *)*_ItemSimilarityRecommender_SimilarItems_default_instance_)();
  }
  if (DAT_00352eb0 == '\x01') {
    DAT_00352eb0 = 0;
    (*(code *)*_ItemSimilarityRecommender_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.Shutdown();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.Shutdown();
  _ItemSimilarityRecommender_default_instance_.Shutdown();
}